

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yprp_extension_instance
               (lys_ypr_ctx_conflict *pctx,ly_stmt substmt,uint8_t substmt_index,
               lysp_ext_instance *ext,int8_t *flag)

{
  uint16_t *puVar1;
  lysp_stmt *stmt;
  char *attr_name;
  uint uVar2;
  lysp_stmt **pplVar3;
  int8_t inner_flag;
  size_t prefix_len;
  char *prefix;
  size_t name_len;
  char *id;
  char *name;
  int8_t local_51;
  uint local_50 [2];
  char *local_48;
  size_t local_40;
  char *local_38;
  char *local_30;
  
  if ((((ext->flags & 0x1000) == 0) && (ext->parent_stmt == substmt)) &&
     (ext->parent_stmt_index == (ulong)substmt_index)) {
    ypr_close_parent(pctx,flag);
    local_51 = '\0';
    if ((ext->def->flags & 0x80) == 0) {
      attr_name = ext->def->argname;
    }
    else {
      attr_name = (char *)0x0;
    }
    uVar2 = 0;
    ypr_open(pctx,ext->name,attr_name,ext->argument,'\0');
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    if ((ext->def->flags & 0x80) != 0) {
      ypr_close_parent(pctx,&local_51);
      local_38 = ext->name;
      ly_parse_nodeid(&local_38,&local_48,(size_t *)local_50,&local_30,&local_40);
      if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
          (undefined1  [24])0x0) {
        uVar2 = (uint)(pctx->field_0).field_0.level * 2;
      }
      ly_print_((pctx->field_0).field_0.out,"%*s<%.*s:%s>",(ulong)uVar2,"",(ulong)local_50[0],
                local_48,ext->def->argname);
      lyxml_dump_text((pctx->field_0).field_0.out,ext->argument,'\0');
      ly_print_((pctx->field_0).field_0.out,"</%.*s:%s>\n",(ulong)local_50[0],local_48,
                ext->def->argname);
    }
    pplVar3 = &ext->child;
    while (stmt = *pplVar3, stmt != (lysp_stmt *)0x0) {
      if ((stmt->flags & 0xc00) == 0) {
        ypr_close_parent(pctx,&local_51);
        yprp_stmt(pctx,stmt);
      }
      pplVar3 = &stmt->next;
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,ext->name,local_51);
  }
  return;
}

Assistant:

static void
yprp_extension_instance(struct lys_ypr_ctx *pctx, enum ly_stmt substmt, uint8_t substmt_index,
        struct lysp_ext_instance *ext, int8_t *flag)
{
    struct lysp_stmt *stmt;
    int8_t inner_flag;

    if ((ext->flags & LYS_INTERNAL) || (ext->parent_stmt != substmt) || (ext->parent_stmt_index != substmt_index)) {
        return;
    }

    ypr_close_parent(pctx, flag);
    inner_flag = 0;

    ypr_open(pctx, ext->name, (ext->def->flags & LYS_YINELEM_TRUE) ? NULL : ext->def->argname, ext->argument, inner_flag);
    LEVEL++;
    if (ext->def->flags & LYS_YINELEM_TRUE) {
        const char *prefix, *name, *id;
        size_t prefix_len, name_len;

        ypr_close_parent(pctx, &inner_flag);

        /* we need to use the same namespace as for the extension instance element */
        id = ext->name;
        ly_parse_nodeid(&id, &prefix, &prefix_len, &name, &name_len);
        ly_print_(pctx->out, "%*s<%.*s:%s>", INDENT, (int)prefix_len, prefix, ext->def->argname);
        lyxml_dump_text(pctx->out, ext->argument, 0);
        ly_print_(pctx->out, "</%.*s:%s>\n", (int)prefix_len, prefix, ext->def->argname);
    }
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }

        ypr_close_parent(pctx, &inner_flag);
        yprp_stmt(pctx, stmt);
    }
    LEVEL--;
    ypr_close(pctx, ext->name, inner_flag);
}